

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

CropLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_crop(NeuralNetworkLayer *this)

{
  bool bVar1;
  CropLayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_crop(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_crop(this);
    this_00 = (CropLayerParams *)operator_new(0x38);
    CropLayerParams::CropLayerParams(this_00);
    (this->layer_).crop_ = this_00;
  }
  return (CropLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::CropLayerParams* NeuralNetworkLayer::mutable_crop() {
  if (!has_crop()) {
    clear_layer();
    set_has_crop();
    layer_.crop_ = new ::CoreML::Specification::CropLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.crop)
  return layer_.crop_;
}